

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void gl4cts::CopyImage::Utils::prepareTexture
               (Context *context,GLuint name,GLenum target,GLenum internal_format,GLenum format,
               GLenum type,GLuint level,GLuint width,GLuint height,GLuint depth,GLvoid *pixels,
               GLuint *out_buf_id)

{
  ostringstream *this;
  int iVar1;
  GLenum GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  char *pcVar5;
  long lVar6;
  GLenum GVar7;
  undefined4 in_register_00000084;
  undefined8 uVar8;
  undefined4 in_register_0000008c;
  undefined8 uVar9;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar4;
  
  uVar9 = CONCAT44(in_register_0000008c,type);
  uVar8 = CONCAT44(in_register_00000084,format);
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  GVar2 = transProxyToRealTarget(target);
  if (GVar2 - 0x8515 < 6) {
LAB_0094aaec:
    (**(code **)(lVar4 + 0xb8))(0x8513,name);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x679);
    (**(code **)(lVar4 + 0x1310))(0x8516,level,internal_format,width,height,0,uVar8,uVar9,pixels);
    (**(code **)(lVar4 + 0x1310))(0x8518,level,internal_format,width,height,0,uVar8,uVar9,pixels);
    (**(code **)(lVar4 + 0x1310))(0x851a,level,internal_format,width,height,0,uVar8,uVar9,pixels);
    (**(code **)(lVar4 + 0x1310))(0x8515,level,internal_format,width,height,0,uVar8,uVar9,pixels);
    (**(code **)(lVar4 + 0x1310))(0x8517,level,internal_format,width,height,0,uVar8,uVar9,pixels);
    GVar7 = 0x8519;
    GVar2 = 0x8513;
LAB_0094acb7:
    (**(code **)(lVar4 + 0x1310))(GVar7,level,internal_format,width,height,0,uVar8,uVar9,pixels);
    pcVar5 = "TexImage2D";
    goto LAB_0094aeb4;
  }
  if (GVar2 == 0xde0) {
    GVar2 = 0xde0;
    (**(code **)(lVar4 + 0xb8))(0xde0,name);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x61b);
    (**(code **)(lVar4 + 0x1308))(0xde0,level,internal_format,width,0,format,uVar9,pixels);
    pcVar5 = "TexImage1D";
    goto LAB_0094aeb4;
  }
  if (GVar2 == 0xde1) {
LAB_0094ac5a:
    (**(code **)(lVar4 + 0xb8))(GVar2,name);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x628);
    GVar7 = GVar2;
    goto LAB_0094acb7;
  }
  if (GVar2 == 0x806f) goto LAB_0094acd5;
  if (GVar2 == 0x84f5) goto LAB_0094ac5a;
  if (GVar2 == 0x8513) goto LAB_0094aaec;
  if (GVar2 == 0x8c18) goto LAB_0094ac5a;
  if (GVar2 == 0x8c1a) {
LAB_0094acd5:
    (**(code **)(lVar4 + 0xb8))(GVar2,name);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x64a);
    (**(code **)(lVar4 + 0x1320))
              (GVar2,level,internal_format,width,height,depth,0,uVar8,uVar9,pixels);
    pcVar5 = "TexImage3D";
LAB_0094aeb4:
    local_1c0.m_value = (**(code **)(lVar4 + 0x800))();
    if (local_1c0.m_value != 0) {
      local_1b0._0_8_ = context->m_testCtx->m_log;
      this = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this);
      std::operator<<((ostream *)this,"Error: ");
      local_1c0.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
      std::operator<<((ostream *)this,". Function: ");
      std::operator<<((ostream *)this,pcVar5);
      std::operator<<((ostream *)this,". Target: ");
      local_1d0.m_getName = glu::getTextureTargetName;
      local_1d0.m_value = GVar2;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this);
      std::operator<<((ostream *)this,". Format: ");
      local_1e0.m_getName = glu::getInternalFormatParameterName;
      local_1e0.m_value = internal_format;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this);
      std::operator<<((ostream *)this,", ");
      pcVar5 = glu::getTextureFormatName(format);
      std::operator<<((ostream *)this,pcVar5);
      std::operator<<((ostream *)this,", ");
      local_1f0.m_getName = glu::getTypeName;
      local_1f0.m_value = type;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)this);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to create texture",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x698);
LAB_0094b197:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (GVar2 == 0x8d41) {
      return;
    }
  }
  else {
    if (GVar2 != 0x8c2a) {
      if (GVar2 == 0x9102) {
        GVar2 = 0x9102;
        (**(code **)(lVar4 + 0xb8))(0x9102,name);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"BindTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                        ,0x63c);
        (**(code **)(lVar4 + 0x1328))(0x9102,1,internal_format,width,height,depth,0);
        pcVar5 = "TexImage3DMultisample";
      }
      else {
        if (GVar2 == 0x9009) goto LAB_0094acd5;
        if (GVar2 != 0x9100) {
          if (GVar2 != 0x8d41) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Invalid enum",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                       ,0x68d);
            goto LAB_0094b197;
          }
          (**(code **)(lVar4 + 0xa0))(0x8d41,name);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"BindRenderbuffer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                          ,0x60f);
          (**(code **)(lVar4 + 0x1238))(0x8d41,internal_format,width,height);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"RenderbufferStorage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                          ,0x612);
          (**(code **)(lVar4 + 0xa0))(0x8d41,0);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          pcVar5 = "BindRenderbuffer";
          iVar1 = 0x615;
          goto LAB_0094b005;
        }
        GVar2 = 0x9100;
        (**(code **)(lVar4 + 0xb8))(0x9100,name);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"BindTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                        ,0x632);
        (**(code **)(lVar4 + 0x1318))(0x9100,1,internal_format,width,height,0);
        pcVar5 = "TexImage2DMultisample";
      }
      goto LAB_0094aeb4;
    }
    (**(code **)(lVar4 + 0x6c8))(1,out_buf_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"GenBuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x654);
    GVar2 = 0x8c2a;
    (**(code **)(lVar4 + 0x40))(0x8c2a,*out_buf_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x657);
    lVar6 = 0x10;
    if (pixels != (GLvoid *)0x0) {
      lVar6 = (long)(int)width;
    }
    (**(code **)(lVar4 + 0x150))(0x8c2a,lVar6,pixels,0x88ea);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BufferData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x664);
    (**(code **)(lVar4 + 0xb8))(0x8c2a,name);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x668);
    (**(code **)(lVar4 + 0x12f8))(0x8c2a,internal_format,*out_buf_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"TexBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x66b);
  }
  (**(code **)(lVar4 + 0xb8))(GVar2,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  pcVar5 = "BindTexture";
  iVar1 = 0x69f;
LAB_0094b005:
  glu::checkError(dVar3,pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,iVar1);
  return;
}

Assistant:

void Utils::prepareTexture(deqp::Context& context, GLuint name, GLenum target, GLenum internal_format, GLenum format,
						   GLenum type, GLuint level, GLuint width, GLuint height, GLuint depth, const GLvoid* pixels,
						   GLuint& out_buf_id)
{
	static const GLint   border		   = 0;
	GLenum				 error		   = 0;
	const GLchar*		 function_name = "unknown";
	const Functions&	 gl			   = context.getRenderContext().getFunctions();
	static const GLsizei samples	   = 1;

	/* Translate proxies into real targets */
	target = transProxyToRealTarget(target);

	/* Initialize */
	switch (target)
	{
	case GL_RENDERBUFFER:
		gl.bindRenderbuffer(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindRenderbuffer");

		gl.renderbufferStorage(target, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "RenderbufferStorage");

		gl.bindRenderbuffer(target, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindRenderbuffer");

		break;

	case GL_TEXTURE_1D:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage1D(target, level, internal_format, width, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage1D";

		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.bindTexture(target, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(target, level, internal_format, width, height, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2DMultisample(target, samples, internal_format, width, height, GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage2DMultisample";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage3DMultisample(target, samples, internal_format, width, height, depth,
								 GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage3DMultisample";

		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		gl.bindTexture(target, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage3D(target, level, internal_format, width, height, depth, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage3D";

		break;

	case GL_TEXTURE_BUFFER:
		gl.genBuffers(1, &out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

		gl.bindBuffer(GL_TEXTURE_BUFFER, out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		{
			GLsizei		  size = 16;
			const GLvoid* data = 0;

			if (0 != pixels)
			{
				size = width;
				data = pixels;
			}

			gl.bufferData(GL_TEXTURE_BUFFER, size, data, GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");
		}

		gl.bindTexture(GL_TEXTURE_BUFFER, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texBuffer(GL_TEXTURE_BUFFER, internal_format, out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexBuffer");

		break;

	case GL_TEXTURE_CUBE_MAP:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
		/* Change target to CUBE_MAP, it will be used later to change base and max level */
		target = GL_TEXTURE_CUBE_MAP;
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, level, internal_format, width, height, border, format, type,
					  pixels);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	if (GL_NO_ERROR != error)
	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error: " << glu::getErrorStr(error) << ". Function: " << function_name
			<< ". Target: " << glu::getTextureTargetStr(target)
			<< ". Format: " << glu::getInternalFormatParameterStr(internal_format) << ", "
			<< glu::getTextureFormatName(format) << ", " << glu::getTypeStr(type) << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to create texture");
	}

	if (GL_RENDERBUFFER != target)
	{
		/* Clean binding point */
		gl.bindTexture(target, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
}